

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

unsigned_long
duckdb::TryCastCInternal<double,unsigned_long,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  double input;
  unsigned_long result_value;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  duckdb_result *in_stack_ffffffffffffffc0;
  undefined8 local_28;
  undefined8 local_8;
  
  input = UnsafeFetch<double>(in_stack_ffffffffffffffc0,
                              CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8),
                              0x1945627);
  bVar1 = TryCast::Operation<double,unsigned_long>
                    (input,(uint64_t *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
                     ,false);
  if (bVar1) {
    local_8 = local_28;
  }
  else {
    local_8 = FetchDefaultValue::Operation<unsigned_long>();
  }
  return local_8;
}

Assistant:

RESULT_TYPE TryCastCInternal(duckdb_result *result, idx_t col, idx_t row) {
	RESULT_TYPE result_value;
	try {
		if (!OP::template Operation<SOURCE_TYPE, RESULT_TYPE>(UnsafeFetch<SOURCE_TYPE>(result, col, row),
		                                                      result_value)) {
			return FetchDefaultValue::Operation<RESULT_TYPE>();
		}
	} catch (...) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	return result_value;
}